

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

int cvLsBandDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,CVodeMem cv_mem,N_Vector tmp1,
                 N_Vector tmp2)

{
  long *plVar1;
  void *pvVar2;
  int iVar3;
  sunindextype sVar4;
  sunindextype sVar5;
  sunindextype sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  sunrealtype *psVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long j;
  double dVar19;
  double dVar20;
  double dVar21;
  double local_c8;
  double local_c0;
  long local_b8;
  long local_a8;
  
  pvVar2 = cv_mem->cv_lmem;
  sVar4 = SUNBandMatrix_Columns(Jac);
  sVar5 = SUNBandMatrix_UpperBandwidth(Jac);
  sVar6 = SUNBandMatrix_LowerBandwidth(Jac);
  lVar7 = N_VGetArrayPointer(cv_mem->cv_ewt);
  lVar8 = N_VGetArrayPointer(fy);
  lVar9 = N_VGetArrayPointer(tmp1);
  lVar10 = N_VGetArrayPointer(y);
  lVar11 = N_VGetArrayPointer(tmp2);
  if (cv_mem->cv_constraintsSet == 0) {
    local_b8 = 0;
  }
  else {
    local_b8 = N_VGetArrayPointer(cv_mem->cv_constraints);
  }
  N_VScale(0x3ff0000000000000,y,tmp2);
  dVar19 = cv_mem->cv_uround;
  local_c0 = 0.0;
  if (0.0 < dVar19) {
    if (dVar19 < 0.0) {
      local_c0 = sqrt(dVar19);
    }
    else {
      local_c0 = SQRT(dVar19);
    }
  }
  dVar19 = (double)N_VWrmsNorm(fy,cv_mem->cv_ewt);
  local_c8 = 1.0;
  if ((dVar19 != 0.0) || (NAN(dVar19))) {
    local_c8 = dVar19 * (double)sVar4 * ABS(cv_mem->cv_h) * 1000.0 * cv_mem->cv_uround;
  }
  lVar17 = sVar5 + sVar6 + 1;
  lVar18 = sVar4;
  if (lVar17 < sVar4) {
    lVar18 = lVar17;
  }
  if (lVar18 < 1) {
    lVar18 = 0;
  }
  lVar16 = 1;
  local_a8 = 0;
  do {
    if (lVar16 == lVar18 + 1) {
      return 0;
    }
    j = lVar16 + -1;
    for (lVar12 = j; lVar12 < sVar4; lVar12 = lVar12 + lVar17) {
      dVar20 = local_c8 / *(double *)(lVar7 + lVar12 * 8);
      dVar19 = ABS(*(double *)(lVar10 + lVar12 * 8)) * local_c0;
      if (dVar19 <= dVar20) {
        dVar19 = dVar20;
      }
      if (cv_mem->cv_constraintsSet != 0) {
        dVar20 = *(double *)(local_b8 + lVar12 * 8);
        dVar21 = ABS(dVar20);
        if ((dVar21 != 1.0) || (NAN(dVar21))) {
          if ((dVar21 == 2.0) &&
             ((!NAN(dVar21) && (dVar20 * (*(double *)(lVar11 + lVar12 * 8) + dVar19) <= 0.0))))
          goto LAB_001267a2;
        }
        else if (dVar20 * (*(double *)(lVar11 + lVar12 * 8) + dVar19) < 0.0) {
LAB_001267a2:
          dVar19 = -dVar19;
        }
      }
      *(double *)(lVar11 + lVar12 * 8) = dVar19 + *(double *)(lVar11 + lVar12 * 8);
    }
    iVar3 = (*cv_mem->cv_f)(t,tmp2,tmp1,cv_mem->cv_user_data);
    plVar1 = (long *)((long)pvVar2 + 0x90);
    *plVar1 = *plVar1 + 1;
    lVar12 = local_a8;
    if (iVar3 != 0) {
      return iVar3;
    }
    for (; j < sVar4; j = j + lVar17) {
      *(undefined8 *)(lVar11 + j * 8) = *(undefined8 *)(lVar10 + j * 8);
      psVar13 = SUNBandMatrix_Column(Jac,j);
      dVar20 = local_c8 / *(double *)(lVar7 + j * 8);
      dVar19 = ABS(*(double *)(lVar10 + j * 8)) * local_c0;
      if (dVar19 <= dVar20) {
        dVar19 = dVar20;
      }
      if (cv_mem->cv_constraintsSet != 0) {
        dVar20 = *(double *)(local_b8 + j * 8);
        dVar21 = ABS(dVar20);
        if ((dVar21 != 1.0) || (NAN(dVar21))) {
          if ((dVar21 == 2.0) &&
             ((!NAN(dVar21) && (dVar20 * (*(double *)(lVar11 + j * 8) + dVar19) <= 0.0))))
          goto LAB_001268d1;
        }
        else if (dVar20 * (*(double *)(lVar11 + j * 8) + dVar19) < 0.0) {
LAB_001268d1:
          dVar19 = -dVar19;
        }
      }
      lVar14 = j - sVar5;
      if (lVar14 < 1) {
        lVar14 = 0;
      }
      lVar15 = sVar6 + j;
      if (sVar4 + -1 <= sVar6 + j) {
        lVar15 = sVar4 + -1;
      }
      for (; lVar14 <= lVar15; lVar14 = lVar14 + 1) {
        *(double *)((long)psVar13 + lVar14 * 8 + lVar12) =
             (*(double *)(lVar9 + lVar14 * 8) - *(double *)(lVar8 + lVar14 * 8)) * (1.0 / dVar19);
      }
      lVar12 = lVar12 + ~(sVar5 + sVar6) * 8;
    }
    lVar16 = lVar16 + 1;
    local_a8 = local_a8 + -8;
  } while( true );
}

Assistant:

int cvLsBandDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                  CVodeMem cv_mem, N_Vector tmp1, N_Vector tmp2)
{
  N_Vector ftemp, ytemp;
  sunrealtype fnorm, minInc, inc, inc_inv, srur, conj;
  sunrealtype *col_j, *ewt_data, *fy_data, *ftemp_data;
  sunrealtype *y_data, *ytemp_data, *cns_data;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  CVLsMem cvls_mem;
  int retval = 0;

  /* initialize cns_data to avoid compiler warning */
  cns_data = NULL;

  /* access LsMem interface structure */
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* access matrix dimensions */
  N      = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of y and f */
  ftemp = tmp1;
  ytemp = tmp2;

  /* Obtain pointers to the data for ewt, fy, ftemp, y, ytemp */
  ewt_data   = N_VGetArrayPointer(cv_mem->cv_ewt);
  fy_data    = N_VGetArrayPointer(fy);
  ftemp_data = N_VGetArrayPointer(ftemp);
  y_data     = N_VGetArrayPointer(y);
  ytemp_data = N_VGetArrayPointer(ytemp);
  if (cv_mem->cv_constraintsSet)
  {
    cns_data = N_VGetArrayPointer(cv_mem->cv_constraints);
  }

  /* Load ytemp with y = predicted y vector */
  N_VScale(ONE, y, ytemp);

  /* Set minimum increment based on uround and norm of f */
  srur   = SUNRsqrt(cv_mem->cv_uround);
  fnorm  = N_VWrmsNorm(fy, cv_mem->cv_ewt);
  minInc = (fnorm != ZERO) ? (MIN_INC_MULT * SUNRabs(cv_mem->cv_h) *
                              cv_mem->cv_uround * N * fnorm)
                           : ONE;

  /* Set bandwidth and number of column groups for band differencing */
  width   = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group = 1; group <= ngroups; group++)
  {
    /* Increment all y_j in group */
    for (j = group - 1; j < N; j += width)
    {
      inc = SUNMAX(srur * SUNRabs(y_data[j]), minInc / ewt_data[j]);

      /* Adjust sign(inc) if yj has an inequality constraint. */
      if (cv_mem->cv_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((ytemp_data[j] + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((ytemp_data[j] + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      ytemp_data[j] += inc;
    }

    /* Evaluate f with incremented y */
    retval = cv_mem->cv_f(t, ytemp, ftemp, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval != 0) { break; }

    /* Restore ytemp, then form and load difference quotients */
    for (j = group - 1; j < N; j += width)
    {
      ytemp_data[j] = y_data[j];
      col_j         = SUNBandMatrix_Column(Jac, j);
      inc           = SUNMAX(srur * SUNRabs(y_data[j]), minInc / ewt_data[j]);

      /* Adjust sign(inc) as before. */
      if (cv_mem->cv_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((ytemp_data[j] + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((ytemp_data[j] + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      inc_inv = ONE / inc;
      i1      = SUNMAX(0, j - mupper);
      i2      = SUNMIN(j + mlower, N - 1);
      for (i = i1; i <= i2; i++)
      {
        SM_COLUMN_ELEMENT_B(col_j, i, j) = inc_inv * (ftemp_data[i] - fy_data[i]);
      }
    }
  }

  return (retval);
}